

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3SetHasStat(Fts3Table *p)

{
  sqlite3_stmt *pStmt_00;
  int iVar1;
  int iVar2;
  char *zSql;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_30;
  
  iVar1 = 0;
  if (p->bHasStat == '\x02') {
    zSql = sqlite3_mprintf("SELECT 1 FROM %Q.sqlite_master WHERE tbl_name=\'%q_stat\'",p->zDb,
                           p->zName);
    if (zSql == (char *)0x0) {
      iVar1 = 7;
    }
    else {
      local_30 = (sqlite3_stmt *)0x0;
      iVar1 = sqlite3LockAndPrepare(p->db,zSql,-1,1,(Vdbe *)0x0,&local_30,(char **)0x0);
      pStmt_00 = local_30;
      if (iVar1 == 0) {
        iVar2 = sqlite3_step(local_30);
        iVar1 = sqlite3_finalize(pStmt_00);
        if (iVar1 == 0) {
          p->bHasStat = iVar2 == 100;
        }
      }
      sqlite3_free(zSql);
    }
  }
  return iVar1;
}

Assistant:

static int fts3SetHasStat(Fts3Table *p){
  int rc = SQLITE_OK;
  if( p->bHasStat==2 ){
    const char *zFmt ="SELECT 1 FROM %Q.sqlite_master WHERE tbl_name='%q_stat'";
    char *zSql = sqlite3_mprintf(zFmt, p->zDb, p->zName);
    if( zSql ){
      sqlite3_stmt *pStmt = 0;
      rc = sqlite3_prepare_v2(p->db, zSql, -1, &pStmt, 0);
      if( rc==SQLITE_OK ){
        int bHasStat = (sqlite3_step(pStmt)==SQLITE_ROW);
        rc = sqlite3_finalize(pStmt);
        if( rc==SQLITE_OK ) p->bHasStat = bHasStat;
      }
      sqlite3_free(zSql);
    }else{
      rc = SQLITE_NOMEM;
    }
  }
  return rc;
}